

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void crnlib::sort_alpha_endpoints
               (vector<unsigned_short> *remapping,unpacked_endpoint *unpacked_endpoints,uint16 n)

{
  unsigned_short uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  unpacked_endpoint *puVar5;
  unsigned_short *puVar6;
  unpacked_endpoint *puVar7;
  ulong uVar8;
  uint error;
  unpacked_endpoint *endpoint;
  uint local_58;
  ushort local_54;
  uint16 i_1;
  uint min_error;
  uint16 selected_index;
  uint16 left;
  unpacked_endpoint selected_endpoint;
  uint16 i;
  undefined1 local_40 [8];
  vector<unsigned_short> indices;
  vector<crnlib::optimize_alpha_params::unpacked_endpoint> endpoints;
  uint16 n_local;
  unpacked_endpoint *unpacked_endpoints_local;
  vector<unsigned_short> *remapping_local;
  
  vector<unsigned_short>::resize(remapping,(uint)n,false);
  vector<crnlib::optimize_alpha_params::unpacked_endpoint>::vector
            ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&indices.m_size,(uint)n);
  vector<unsigned_short>::vector((vector<unsigned_short> *)local_40,(uint)n);
  for (min_error._2_2_ = 0; min_error._2_2_ < n; min_error._2_2_ = min_error._2_2_ + 1) {
    uVar8 = (ulong)min_error._2_2_;
    puVar5 = vector<crnlib::optimize_alpha_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&indices.m_size,
                        (uint)min_error._2_2_);
    uVar2 = min_error._2_2_;
    *puVar5 = unpacked_endpoints[uVar8];
    puVar6 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)local_40,(uint)min_error._2_2_);
    *puVar6 = uVar2;
  }
  memset(&min_error,0,2);
  i_1 = n;
  while (i_1 != 0) {
    local_54 = 0;
    local_58 = 0xffffffff;
    for (endpoint._6_2_ = 0; endpoint._6_2_ < i_1; endpoint._6_2_ = endpoint._6_2_ + 1) {
      puVar5 = vector<crnlib::optimize_alpha_params::unpacked_endpoint>::operator[]
                         ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)
                          &indices.m_size,(uint)endpoint._6_2_);
      iVar3 = math::square<int>((uint)puVar5->low - (uint)(byte)min_error);
      iVar4 = math::square<int>((uint)puVar5->high - (uint)min_error._1_1_);
      if ((uint)(iVar3 + iVar4) < local_58) {
        local_54 = endpoint._6_2_;
        local_58 = iVar3 + iVar4;
      }
    }
    puVar5 = vector<crnlib::optimize_alpha_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&indices.m_size,
                        (uint)local_54);
    min_error._0_2_ = *puVar5;
    puVar6 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)local_40,(uint)local_54);
    puVar6 = vector<unsigned_short>::operator[](remapping,(uint)*puVar6);
    *puVar6 = n - i_1;
    i_1 = i_1 - 1;
    puVar5 = vector<crnlib::optimize_alpha_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&indices.m_size,
                        (uint)i_1);
    puVar7 = vector<crnlib::optimize_alpha_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&indices.m_size,
                        (uint)local_54);
    *puVar7 = *puVar5;
    puVar6 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)local_40,(uint)i_1);
    uVar1 = *puVar6;
    puVar6 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)local_40,(uint)local_54);
    *puVar6 = uVar1;
  }
  vector<unsigned_short>::~vector((vector<unsigned_short> *)local_40);
  vector<crnlib::optimize_alpha_params::unpacked_endpoint>::~vector
            ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&indices.m_size);
  return;
}

Assistant:

static void sort_alpha_endpoints(crnlib::vector<uint16>& remapping, const optimize_alpha_params::unpacked_endpoint* unpacked_endpoints, uint16 n)
    {
        remapping.resize(n);
        crnlib::vector<optimize_alpha_params::unpacked_endpoint> endpoints(n);
        crnlib::vector<uint16> indices(n);
        for (uint16 i = 0; i < n; i++)
        {
            endpoints[i] = unpacked_endpoints[i];
            indices[i] = i;
        }
        optimize_alpha_params::unpacked_endpoint selected_endpoint = { 0, 0 };
        for (uint16 left = n; left;)
        {
            uint16 selected_index = 0;
            uint min_error = cUINT32_MAX;
            for (uint16 i = 0; i < left; i++)
            {
                optimize_alpha_params::unpacked_endpoint& endpoint = endpoints[i];
                uint error = math::square(endpoint.low - selected_endpoint.low) + math::square(endpoint.high - selected_endpoint.high);
                if (error < min_error)
                {
                    min_error = error;
                    selected_index = i;
                }
            }
            selected_endpoint = endpoints[selected_index];
            remapping[indices[selected_index]] = n - left;
            left--;
            endpoints[selected_index] = endpoints[left];
            indices[selected_index] = indices[left];
        }
    }